

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QString>::data(QList<QString> *this)

{
  QArrayDataPointer<QString> *this_00;
  QString *pQVar1;
  QArrayDataPointer<QString> *in_RDI;
  
  detach((QList<QString> *)0x18215c);
  this_00 = (QArrayDataPointer<QString> *)QArrayDataPointer<QString>::operator->(in_RDI);
  pQVar1 = QArrayDataPointer<QString>::data(this_00);
  return pQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }